

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O0

void skip_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  jpeg_source_mgr *pjVar1;
  jpeg_source_mgr *src;
  long num_bytes_local;
  j_decompress_ptr cinfo_local;
  
  pjVar1 = cinfo->src;
  src = (jpeg_source_mgr *)num_bytes;
  if (0 < num_bytes) {
    while ((long)pjVar1->bytes_in_buffer < (long)src) {
      src = (jpeg_source_mgr *)((long)src - pjVar1->bytes_in_buffer);
      (*pjVar1->fill_input_buffer)(cinfo);
    }
    pjVar1->next_input_byte =
         (JOCTET *)((long)&src->next_input_byte + (long)pjVar1->next_input_byte);
    pjVar1->bytes_in_buffer = pjVar1->bytes_in_buffer - (long)src;
  }
  return;
}

Assistant:

METHODDEF(void)
skip_input_data (j_decompress_ptr cinfo, long num_bytes)
{
  struct jpeg_source_mgr * src = cinfo->src;

  /* Just a dumb implementation for now.  Could use fseek() except
   * it doesn't work on pipes.  Not clear that being smart is worth
   * any trouble anyway --- large skips are infrequent.
   */
  if (num_bytes > 0) {
    while (num_bytes > (long) src->bytes_in_buffer) {
      num_bytes -= (long) src->bytes_in_buffer;
      (void) (*src->fill_input_buffer) (cinfo);
      /* note we assume that fill_input_buffer will never return FALSE,
       * so suspension need not be handled.
       */
    }
    src->next_input_byte += (size_t) num_bytes;
    src->bytes_in_buffer -= (size_t) num_bytes;
  }
}